

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O0

void __thiscall ninx::parser::element::IfStatement::set_parent(IfStatement *this,Block *parent)

{
  bool bVar1;
  reference this_00;
  pointer pIVar2;
  pointer pBVar3;
  unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_> *c;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  *__range1;
  Block *parent_local;
  IfStatement *this_local;
  
  ASTElement::set_parent((ASTElement *)this,parent);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
           ::begin(&this->cases);
  c = (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
       *)std::
         vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
         ::end(&this->cases);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
                                     *)&c), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
              ::operator*(&__end1);
    pIVar2 = std::
             unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
             ::operator->(this_00);
    (*(pIVar2->super_ASTElement)._vptr_ASTElement[4])(pIVar2,parent);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->else_body);
  if (bVar1) {
    pBVar3 = std::
             unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ::operator->(&this->else_body);
    (*(pBVar3->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[4])
              (pBVar3,parent);
  }
  return;
}

Assistant:

void ninx::parser::element::IfStatement::set_parent(ninx::parser::element::Block *parent) {
    ASTElement::set_parent(parent);

    for (auto &c : cases) {
        c->set_parent(parent);
    }

    if (this->else_body) {
        this->else_body->set_parent(parent);
    }
}